

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap64::VerifyMarkCountForPages<256u>
          (HeapBlockMap64 *this,void *address,uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Node *pNVar4;
  
  for (pNVar4 = this->list; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->next) {
    if (pNVar4->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006c1f2e;
  }
  pNVar4 = (Node *)0x0;
LAB_006c1f2e:
  if (pNVar4 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x610,"(node != nullptr)","node != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  HeapBlockMap32::VerifyMarkCountForPages<256u>(&pNVar4->map,address,pageCount);
  return;
}

Assistant:

void
HeapBlockMap64::VerifyMarkCountForPages(void * address, uint pageCount)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);

    node->map.VerifyMarkCountForPages<BitVectorCount>(address, pageCount);
}